

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rand.cpp
# Opt level: O0

uint __thiscall
ON_RandomNumberGenerator::RandomUnsignedInteger(ON_RandomNumberGenerator *this,uint i0,uint i1)

{
  uint local_2c;
  ON__UINT32 local_28;
  int local_24;
  ON__UINT32 delta;
  ON__UINT32 r;
  uint i1_local;
  uint i0_local;
  ON_RandomNumberGenerator *this_local;
  
  local_28 = RandomNumber(this);
  if (i0 < i1) {
    local_24 = i1 - i0;
  }
  else {
    local_24 = i0 - i1;
  }
  if (local_24 != -1) {
    local_2c = i1;
    if (i0 < i1) {
      local_2c = i0;
    }
    local_28 = local_2c + local_28 % (local_24 + 1U);
  }
  return local_28;
}

Assistant:

unsigned int ON_RandomNumberGenerator::RandomUnsignedInteger(unsigned int i0, unsigned int i1)
{
  const ON__UINT32 r = RandomNumber();
  const ON__UINT32 delta = (i0 < i1) ? (i1 - i0) : (i0 - i1);
  return
    (0xFFFFFFFFU == delta)
    ? ((int)r) // avoid delta+1 overflow and crash
    : (((i0 < i1) ? i0 : i1) + (r % (delta + 1U)))
    ;
}